

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_data__int2____int2
          (ColladaParserAutoGen14Private *this,ParserChar *text,size_t textLength)

{
  bool bVar1;
  
  bVar1 = GeneratedSaxParser::
          ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
          ::characterData2Data<long_long,_&GeneratedSaxParser::Utils::toSint64>
                    (&this->
                      super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                     ,text,textLength,0x82bfdc,0);
  return bVar1;
}

Assistant:

bool ColladaParserAutoGen14Private::_data__int2____int2( const ParserChar* text, size_t textLength )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
        int2____int2__ValidationData* validationData = (int2____int2__ValidationData*)mValidationDataStack.top();
        DISABLE_WARNING_UNUSED(validationData)
return characterData2Sint64Data(text, textLength, &ColladaParserAutoGen14::data__int2____int2, &validate__int2__stream, &validationData->validationWholeSize, 0);
    }
    else
    {
return characterData2Sint64Data(text, textLength, &ColladaParserAutoGen14::data__int2____int2);
    }
#else
    {
return characterData2Sint64Data(text, textLength, &ColladaParserAutoGen14::data__int2____int2);
    } // validation
#endif

}